

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# agg_trans_single_path.cpp
# Opt level: O3

void __thiscall agg::trans_single_path::transform(trans_single_path *this,double *x,double *y)

{
  vertex_dist **ppvVar1;
  undefined1 auVar2 [16];
  uint uVar3;
  uint uVar4;
  ulong uVar5;
  ulong uVar6;
  vertex_dist *pvVar7;
  uint uVar8;
  ulong uVar9;
  vertex_dist *pvVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  undefined1 auVar17 [16];
  undefined1 auVar18 [16];
  undefined1 auVar19 [16];
  
  if (this->m_status == ready) {
    if (this->m_base_length <= 1e-10) {
      dVar11 = *x;
    }
    else {
      uVar3 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size - 1;
      dVar11 = ((this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks[uVar3 >> 6]
                [uVar3 & 0x3f].dist / this->m_base_length) * *x;
      *x = dVar11;
    }
    if (0.0 <= dVar11) {
      uVar4 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_size;
      uVar3 = uVar4 - 1;
      uVar5 = (ulong)uVar3;
      ppvVar1 = (this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
      uVar6 = (ulong)(uVar3 >> 6);
      uVar9 = (ulong)(uVar3 & 0x3f);
      dVar12 = ppvVar1[uVar6][uVar9].dist;
      if (dVar11 <= dVar12) {
        if (this->m_preserve_x_scale == true) {
          uVar4 = 0;
          if (1 < uVar3) {
            uVar4 = 0;
            do {
              uVar8 = (int)uVar5 + uVar4;
              uVar3 = uVar8 >> 1;
              if (dVar11 < ppvVar1[uVar8 >> 7][uVar3 & 0x3f].dist) {
                uVar5 = (ulong)uVar3;
                uVar3 = uVar4;
              }
              uVar4 = uVar3;
            } while (1 < (uint)uVar5 - uVar4);
            uVar6 = uVar5 >> 6;
            uVar9 = (ulong)((uint)uVar5 & 0x3f);
          }
          pvVar10 = ppvVar1[uVar4 >> 6];
          uVar5 = (ulong)(uVar4 & 0x3f);
          pvVar7 = ppvVar1[uVar6];
          dVar12 = pvVar7[uVar9].dist - pvVar10[uVar5].dist;
          dVar11 = dVar11 - pvVar10[uVar5].dist;
        }
        else {
          dVar11 = dVar11 * this->m_kindex;
          uVar6 = (ulong)dVar11;
          uVar3 = (uint)uVar6 + 1;
          pvVar7 = ppvVar1[uVar3 >> 6];
          uVar9 = (ulong)(uVar3 & 0x3f);
          pvVar10 = ppvVar1[uVar6 >> 6 & 0x3ffffff];
          uVar5 = (ulong)((uint)uVar6 & 0x3f);
          dVar12 = pvVar7[uVar9].dist - pvVar10[uVar5].dist;
          dVar11 = (dVar11 - (double)(uVar6 & 0xffffffff)) * dVar12;
        }
        dVar13 = pvVar10[uVar5].x;
        dVar14 = pvVar10[uVar5].y;
        dVar15 = pvVar7[uVar9].x - dVar13;
        dVar16 = pvVar7[uVar9].y - dVar14;
      }
      else {
        pvVar10 = ppvVar1[uVar6] + uVar9;
        uVar4 = uVar4 - 2;
        uVar3 = uVar4 & 0x3f;
        dVar13 = pvVar10->x;
        dVar14 = pvVar10->y;
        pvVar10 = ppvVar1[uVar4 >> 6] + uVar3;
        dVar15 = dVar13 - pvVar10->x;
        dVar16 = dVar14 - pvVar10->y;
        dVar11 = dVar11 - dVar12;
        dVar12 = dVar12 - ppvVar1[uVar4 >> 6][uVar3].dist;
      }
    }
    else {
      pvVar10 = *(this->m_src_vertices).super_pod_bvector<agg::vertex_dist,_6U>.m_blocks;
      dVar13 = pvVar10->x;
      dVar14 = pvVar10->y;
      dVar15 = pvVar10[1].x - dVar13;
      dVar16 = pvVar10[1].y - dVar14;
      dVar12 = pvVar10[1].dist - pvVar10->dist;
    }
    auVar17._0_8_ = dVar11 * dVar15;
    auVar17._8_8_ = *y * dVar16;
    auVar18._8_8_ = dVar12;
    auVar18._0_8_ = dVar12;
    auVar18 = divpd(auVar17,auVar18);
    *x = (dVar13 + auVar18._0_8_) - auVar18._8_8_;
    auVar19._0_8_ = *y * dVar15;
    auVar19._8_8_ = dVar11 * dVar16;
    auVar2._8_8_ = dVar12;
    auVar2._0_8_ = dVar12;
    auVar18 = divpd(auVar19,auVar2);
    *y = dVar14 + auVar18._8_8_ + auVar18._0_8_;
  }
  return;
}

Assistant:

void trans_single_path::transform(double *x, double *y) const
    {
        if(m_status == ready)
        {
            if(m_base_length > 1e-10)
            {
                *x *= m_src_vertices[m_src_vertices.size() - 1].dist / 
                      m_base_length;
            }

            double x1 = 0.0;
            double y1 = 0.0;
            double dx = 1.0;
            double dy = 1.0;
            double d  = 0.0;
            double dd = 1.0;
            if(*x < 0.0)
            {
                // Extrapolation on the left
                //--------------------------
                x1 = m_src_vertices[0].x;
                y1 = m_src_vertices[0].y;
                dx = m_src_vertices[1].x - x1;
                dy = m_src_vertices[1].y - y1;
                dd = m_src_vertices[1].dist - m_src_vertices[0].dist;
                d  = *x;
            }
            else
            if(*x > m_src_vertices[m_src_vertices.size() - 1].dist)
            {
                // Extrapolation on the right
                //--------------------------
                unsigned i = m_src_vertices.size() - 2;
                unsigned j = m_src_vertices.size() - 1;
                x1 = m_src_vertices[j].x;
                y1 = m_src_vertices[j].y;
                dx = x1 - m_src_vertices[i].x;
                dy = y1 - m_src_vertices[i].y;
                dd = m_src_vertices[j].dist - m_src_vertices[i].dist;
                d  = *x - m_src_vertices[j].dist;
            }
            else
            {
                // Interpolation
                //--------------------------
                unsigned i = 0;
                unsigned j = m_src_vertices.size() - 1;
                if(m_preserve_x_scale)
                {
                    unsigned k;
                    for(i = 0; (j - i) > 1; ) 
                    {
                        if(*x < m_src_vertices[k = (i + j) >> 1].dist) 
                        {
                            j = k; 
                        }
                        else 
                        {
                            i = k;
                        }
                    }
                    d  = m_src_vertices[i].dist;
                    dd = m_src_vertices[j].dist - d;
                    d  = *x - d;
                }
                else
                {
                    i = unsigned(*x * m_kindex);
                    j = i + 1;
                    dd = m_src_vertices[j].dist - m_src_vertices[i].dist;
                    d = ((*x * m_kindex) - i) * dd;
                }
                x1 = m_src_vertices[i].x;
                y1 = m_src_vertices[i].y;
                dx = m_src_vertices[j].x - x1;
                dy = m_src_vertices[j].y - y1;
            }
            double x2 = x1 + dx * d / dd;
            double y2 = y1 + dy * d / dd;
            *x = x2 - *y * dy / dd;
            *y = y2 + *y * dx / dd;
        }
    }